

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::SetTabItemClosed(char *label)

{
  ImGuiTabBar *tab_bar_00;
  ImU32 tab_id;
  ImGuiTabItem *pIVar1;
  ImGuiWindow *in_RDX;
  ImGuiTabBar *tab_bar;
  
  tab_bar_00 = GImGui->CurrentTabBar;
  if ((tab_bar_00 != (ImGuiTabBar *)0x0) && ((tab_bar_00->Flags & 0x100000) == 0)) {
    tab_id = TabBarCalcTabID(tab_bar_00,label,in_RDX);
    pIVar1 = TabBarFindTabByID(tab_bar_00,tab_id);
    if (pIVar1 != (ImGuiTabItem *)0x0) {
      pIVar1->WantClose = true;
    }
  }
  return;
}

Assistant:

void    ImGui::SetTabItemClosed(const char* label)
{
    ImGuiContext& g = *GImGui;
    bool is_within_manual_tab_bar = g.CurrentTabBar && !(g.CurrentTabBar->Flags & ImGuiTabBarFlags_DockNode);
    if (is_within_manual_tab_bar)
    {
        ImGuiTabBar* tab_bar = g.CurrentTabBar;
        ImGuiID tab_id = TabBarCalcTabID(tab_bar, label, NULL);
        if (ImGuiTabItem* tab = TabBarFindTabByID(tab_bar, tab_id))
            tab->WantClose = true; // Will be processed by next call to TabBarLayout()
    }
}